

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

int htmlParseCharData(htmlParserCtxtPtr ctxt,int partial)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  xmlParserInputPtr pxVar4;
  int iVar5;
  int iVar6;
  char cVar7;
  char cVar8;
  uint uVar9;
  ulong len;
  xmlChar *pxVar10;
  char cVar11;
  int iVar12;
  uint mode;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  byte *pbVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  byte *buf;
  int c;
  int iVar25;
  size_t oldAvail;
  byte *pbVar26;
  bool bVar27;
  int skip;
  int replSize;
  xmlChar utf8Char [4];
  int local_90;
  int local_8c;
  byte *local_88;
  int local_7c;
  htmlParserCtxtPtr local_78;
  byte *local_70;
  xmlChar *local_68;
  xmlParserInputPtr local_60;
  int local_54;
  uint local_50;
  int local_4c;
  xmlChar *local_48;
  ulong local_40;
  xmlChar local_34 [4];
  
  local_60 = ctxt->input;
  uVar23 = local_60->flags & 0x40;
  mode = ctxt->endCheckState;
  local_4c = local_60->line;
  pbVar16 = (byte *)(ulong)(uint)local_60->col;
  cVar7 = '\0';
  local_54 = 0;
  local_8c = partial;
  local_78 = ctxt;
  do {
    if (1 < ctxt->disableSAX) break;
    uVar21 = 0;
    local_90 = 0;
    buf = local_60->cur;
    local_7c = 0;
    pbVar26 = buf;
    if (ctxt->disableSAX < 2) {
      c = 0;
      uVar21 = 0;
      iVar25 = 0;
      local_68 = "";
      uVar13 = (long)local_60->end - (long)buf;
LAB_0016be01:
      pxVar4 = local_60;
      iVar19 = (int)uVar21;
      len = uVar13;
      if (uVar13 < 0x41) {
        if (uVar23 == 0) {
          lVar24 = (long)buf - (long)pbVar26;
          local_60->cur = pbVar26;
          local_88 = pbVar16;
          xmlParserGrow(ctxt);
          pbVar26 = pxVar4->cur;
          buf = pbVar26 + lVar24;
          pxVar4->cur = buf;
          len = (long)pxVar4->end - (long)pbVar26;
          uVar23 = (uint)(uVar13 == len);
          pbVar16 = local_88;
          ctxt = local_78;
        }
        if (len != 0) goto LAB_0016be73;
        lVar24 = -(long)iVar19;
        if (local_8c == 0 || iVar25 == 0) {
          lVar24 = 0;
        }
        else {
          uVar21 = 0;
        }
        pbVar26 = pbVar26 + lVar24;
        cVar7 = '\x01';
        cVar11 = '\x05';
LAB_0016c0a8:
        len = 0;
        goto LAB_0016c1f8;
      }
LAB_0016be73:
      iVar12 = local_8c;
      if (iVar25 == 0) {
        if ((htmlParseCharData::mask[*pbVar26 >> 5] >> (*pbVar26 & 0x1f) & 1) == 0) {
          iVar5 = (int)len;
          iVar6 = (int)pbVar16;
          pbVar2 = pbVar26 + len;
          do {
            bVar27 = len == 1;
            if (bVar27) {
              pbVar16 = (byte *)(ulong)(uint)(iVar5 + iVar6);
              len = 0;
              pbVar26 = pbVar2;
              break;
            }
            pbVar16 = (byte *)(ulong)((int)pbVar16 + 1);
            pbVar1 = pbVar26 + 1;
            pbVar26 = pbVar26 + 1;
            len = len - 1;
          } while ((htmlParseCharData::mask[*pbVar1 >> 5] >> (*pbVar1 & 0x1f) & 1) == 0);
        }
        else {
          bVar27 = false;
        }
        cVar11 = '\x04';
        if ((uVar23 == 0) && (len < 0x41)) {
          uVar23 = 0;
          goto LAB_0016c1f8;
        }
        if (bVar27) goto LAB_0016c0a8;
      }
      pbVar16 = (byte *)(ulong)((int)pbVar16 + 1);
      bVar3 = *pbVar26;
      if (iVar25 == 0) {
        if (0x25 < bVar3) {
          if (bVar3 == 0x26) {
            if (mode < 2) {
              if ((len < 2) || (pbVar26[1] != 0x23)) {
                if (local_8c != 0) {
                  bVar27 = len < 2;
                  if (!bVar27) {
                    uVar13 = len - 2;
                    if (0x1d < uVar13) {
                      uVar13 = 0x1e;
                    }
                    uVar17 = 2;
                    do {
                      if ((0x19 < (byte)((pbVar26[uVar17 - 1] | 0x20) + 0x9f)) &&
                         ((uVar17 - 1 < 2 || (9 < (byte)(pbVar26[uVar17 - 1] - 0x30))))) break;
                      bVar27 = len <= uVar17;
                      lVar24 = ~uVar13 + uVar17;
                      uVar17 = uVar17 + 1;
                    } while (lVar24 != 1);
                  }
                  cVar8 = '\x01';
                  if (bVar27 != false) {
                    cVar11 = bVar27 << 3;
LAB_0016c67e:
                    iVar25 = 0;
                    cVar7 = cVar8;
                    goto LAB_0016c1f8;
                  }
                }
                local_70 = (byte *)CONCAT44(local_70._4_4_,iVar19);
                local_88 = buf;
                local_68 = htmlFindEntityPrefix(pbVar26 + 1,len - 1,0,&local_90,&local_7c);
                if (local_68 != (xmlChar *)0x0) {
                  local_90 = local_90 + 1;
LAB_0016c3de:
                  cVar11 = '\b';
                  iVar25 = 0;
                  uVar21 = (ulong)local_70 & 0xffffffff;
                  ctxt = local_78;
                  buf = local_88;
                  goto LAB_0016c1f8;
                }
                local_90 = 0;
                uVar9 = 1;
                uVar13 = 1;
                local_68 = (xmlChar *)0x0;
                iVar25 = 0;
                uVar21 = (ulong)local_70 & 0xffffffff;
                ctxt = local_78;
                buf = local_88;
              }
              else {
                uVar9 = 1;
                uVar13 = 2;
                iVar25 = 0;
                if (len != 2) {
                  if ((pbVar26[2] & 0xdf) == 0x58) {
                    uVar13 = 3;
                    if ((3 < len) &&
                       (((byte)(pbVar26[3] - 0x30) < 10 || ((byte)((pbVar26[3] | 0x20) + 0x9f) < 6))
                       )) {
                      c = 0;
                      uVar21 = 3;
                      uVar9 = 3;
                      iVar25 = 0x10;
                    }
                  }
                  else {
                    iVar25 = 0;
                    if ((byte)(pbVar26[2] - 0x30) < 10) {
                      c = 0;
                      uVar21 = 2;
                      iVar25 = 10;
                      uVar9 = 2;
                    }
                  }
                }
              }
              if ((local_8c != 0) && (len <= uVar13)) {
                cVar7 = '\x01';
                cVar11 = '\b';
                goto LAB_0016c1f8;
              }
              goto LAB_0016c1ee;
            }
LAB_0016c1e6:
            uVar9 = 1;
          }
          else {
            if (bVar3 == 0x2d) {
              if (0xfffffffd < mode - 7) {
                uVar13 = 1;
                if ((((1 < len) && (pbVar26[1] == 0x2d)) && (uVar13 = 2, len != 2)) &&
                   (pbVar26[2] == 0x3e)) {
                  mode = 4;
                }
                goto joined_r0x0016c289;
              }
              goto LAB_0016c1e6;
            }
            if (bVar3 != 0x3c) goto LAB_0016c168;
            uVar9 = 1;
            if (mode == 0) {
              iVar25 = 0;
              cVar11 = '\b';
              cVar7 = '\x01';
              local_54 = 1;
              goto LAB_0016c1f8;
            }
            if (mode != 3) {
              uVar13 = 1;
              if (1 < len) {
                if ((mode == 4) && (pbVar26[1] == 0x21)) {
                  mode = 4;
                  uVar13 = 2;
                  if (((len != 2) && (pbVar26[2] == 0x2d)) && (uVar13 = 3, 3 < len)) {
                    mode = pbVar26[3] == 0x2d | 4;
                  }
                }
                else {
                  bVar3 = pbVar26[1];
                  uVar13 = (ulong)(bVar3 == 0x2f) + 1;
                  cVar11 = '\0';
                  bVar27 = true;
                  if ((bVar3 == 0x2f) || (mode == 5)) {
                    local_48 = (xmlChar *)CONCAT71(local_48._1_7_,bVar3);
                    uVar17 = len - uVar13;
                    bVar27 = len >= uVar13 && uVar17 != 0;
                    if (len < uVar13 || uVar17 == 0) {
                      uVar18 = 0;
                    }
                    else {
                      bVar15 = *ctxt->name;
                      local_50 = uVar23;
                      if (bVar15 == 0) {
                        uVar18 = 0;
                        local_88 = buf;
                      }
                      else {
                        local_70 = pbVar26 + uVar13;
                        uVar22 = 0;
                        do {
                          if (bVar15 != (local_70[uVar22] | 0x20)) break;
                          bVar27 = uVar13 + uVar22 + 1 < len;
                          uVar14 = len;
                          uVar18 = uVar17;
                          if ((uVar13 - len) + 1 + uVar22 == 0) goto LAB_0016c59e;
                          bVar15 = ctxt->name[uVar22 + 1];
                          uVar22 = uVar22 + 1;
                        } while (bVar15 != 0);
                        uVar14 = uVar13 + uVar22;
                        uVar18 = uVar22;
LAB_0016c59e:
                        uVar18 = uVar18 & 0xffffffff;
                        uVar13 = uVar14;
                        ctxt = local_78;
                        local_88 = buf;
                        local_40 = uVar17;
                      }
                    }
                    if ((ctxt->name[uVar18] == '\0') && (bVar27)) {
                      bVar15 = pbVar26[uVar13];
                      if ((((ulong)bVar15 < 0x3f) &&
                          ((0x4000800100000000U >> ((ulong)bVar15 & 0x3f) & 1) != 0)) ||
                         (bVar15 != 0xb && (byte)(bVar15 - 9) < 5)) {
                        if ((mode == 5) && (bVar3 != 0x2f)) {
                          mode = 6;
                        }
                        else {
                          if (mode != 6) {
                            cVar7 = '\x01';
                            cVar11 = '\b';
                            bVar27 = false;
                            local_54 = 1;
                            goto LAB_0016c650;
                          }
                          mode = 5;
                        }
                      }
                    }
                    cVar11 = '\0';
                    bVar27 = true;
                  }
LAB_0016c650:
                  cVar8 = cVar7;
                  if (!bVar27) goto LAB_0016c67e;
                }
              }
joined_r0x0016c289:
              iVar25 = 0;
              uVar9 = 1;
              if (local_8c != 0) {
                iVar25 = 0;
                uVar9 = 1;
                if (len <= uVar13) {
                  iVar25 = 0;
                  cVar11 = '\b';
                  cVar7 = '\x01';
                  goto LAB_0016c1f8;
                }
              }
              goto LAB_0016c1ee;
            }
          }
LAB_0016c1eb:
          iVar25 = 0;
          goto LAB_0016c1ee;
        }
        if (bVar3 == 0) {
LAB_0016c0c5:
          local_7c = 3;
          local_68 = (xmlChar *)anon_var_dwarf_11ebd;
LAB_0016c0cf:
          local_90 = 1;
          iVar25 = 0;
          cVar11 = '\b';
        }
        else {
          if (bVar3 == 10) {
            local_4c = local_4c + 1;
            iVar25 = 0;
            pbVar16 = &DAT_00000001;
            uVar9 = 1;
            goto LAB_0016c1ee;
          }
          if (bVar3 == 0xd) {
            iVar25 = 0;
            cVar11 = '\b';
            if ((local_8c == 0) || (1 < len)) {
              local_90 = 1;
              if (pbVar26[1] != 10) {
                local_7c = 1;
                local_68 = "\n";
                goto LAB_0016c0cf;
              }
            }
            else {
              len = 1;
              cVar7 = '\x01';
            }
          }
          else {
LAB_0016c168:
            if (-1 < (char)bVar3) goto LAB_0016c1e6;
            if ((local_60->flags & 1) != 0) {
              local_70 = (byte *)CONCAT44(local_70._4_4_,iVar19);
              local_88 = buf;
              uVar9 = htmlValidateUtf8(ctxt,pbVar26,len,local_8c);
              if ((iVar12 == 0) || (uVar9 != 0)) {
                uVar21 = (ulong)local_70 & 0xffffffff;
                ctxt = local_78;
                buf = local_88;
                if (0 < (int)uVar9) goto LAB_0016c1eb;
                goto LAB_0016c0c5;
              }
              cVar7 = '\x01';
              goto LAB_0016c3de;
            }
            cVar11 = '\b';
            iVar25 = 0;
            if (pbVar26 <= buf) {
              local_70 = (byte *)CONCAT44(local_70._4_4_,iVar19);
              local_88 = buf;
              pxVar10 = htmlFindEncoding(ctxt);
              if (pxVar10 == (xmlChar *)0x0) {
                xmlSwitchEncoding(ctxt,XML_CHAR_ENCODING_8859_1);
              }
              else {
                local_48 = pxVar10;
                xmlSwitchEncodingName(ctxt,(char *)pxVar10);
                (*xmlFree)(local_48);
              }
              *(byte *)&local_60->flags = (byte)local_60->flags | 1;
              uVar23 = ctxt->input->flags & 0x40;
              cVar11 = '\x10';
              uVar21 = (ulong)local_70 & 0xffffffff;
              buf = local_88;
              cVar8 = cVar7;
              goto LAB_0016c67e;
            }
          }
        }
      }
      else {
        if ((byte)(bVar3 - 0x30) < 10) {
          iVar12 = bVar3 - 0x30;
LAB_0016bf5d:
          c = c * iVar25 + iVar12;
          if (0x10ffff < c) {
            c = 0x110000;
          }
          uVar20 = iVar19 + 1;
          bVar27 = true;
          uVar9 = 1;
        }
        else {
          if ((iVar25 == 0x10) && ((bVar3 | 0x20) - 0x61 < 6)) {
            iVar12 = (bVar3 | 0x20) - 0x57;
            goto LAB_0016bf5d;
          }
          uVar9 = (uint)(bVar3 == 0x3b);
          pbVar26 = pbVar26 + uVar9;
          uVar20 = iVar19 + uVar9;
          uVar9 = uVar9 + 1;
          bVar27 = false;
        }
        uVar21 = (ulong)uVar20;
        cVar11 = '\b';
        if (bVar27) {
LAB_0016c1ee:
          pbVar26 = pbVar26 + uVar9;
          len = len - uVar9;
          cVar11 = '\0';
        }
      }
LAB_0016c1f8:
      switch(cVar11) {
      case '\0':
      case '\x04':
        goto switchD_0016c211_caseD_0;
      case '\x01':
      case '\x02':
      case '\x03':
      case '\x06':
      case '\a':
        goto switchD_0016c211_caseD_1;
      case '\x05':
      case '\b':
        goto switchD_0016c211_caseD_5;
      default:
        if (cVar11 == '\x10') {
          cVar11 = '\0';
        }
        goto switchD_0016c211_caseD_1;
      }
    }
    local_68 = "";
    c = 0;
switchD_0016c211_caseD_5:
    pxVar10 = local_68;
    if (0 < (int)uVar21) {
      pbVar26 = pbVar26 + -uVar21;
      local_90 = (int)uVar21;
      htmlCodePointToUtf8(c,local_34,&local_7c);
      ctxt = local_78;
      pxVar10 = local_34;
    }
    lVar24 = (long)pbVar26 - (long)buf;
    if (buf <= pbVar26 && lVar24 != 0) {
      local_60->cur = local_60->cur + lVar24;
      htmlCharDataSAXCallback(ctxt,buf,(int)lVar24,mode);
      ctxt = local_78;
    }
    local_60->cur = local_60->cur + local_90;
    if (0 < local_7c) {
      htmlCharDataSAXCallback(ctxt,pxVar10,local_7c,mode);
      ctxt = local_78;
    }
    pxVar4 = ctxt->input;
    if ((((pxVar4->flags & 0x40) == 0) && (500 < (long)pxVar4->cur - (long)pxVar4->base)) &&
       ((long)pxVar4->end - (long)pxVar4->cur < 500)) {
      xmlParserShrink(ctxt);
      ctxt = local_78;
    }
    cVar11 = cVar7 * '\x03';
switchD_0016c211_caseD_1:
  } while (cVar11 == '\0');
  local_60->line = local_4c;
  local_60->col = (int)pbVar16;
  uVar23 = 0;
  if (local_54 == 0) {
    uVar23 = mode;
  }
  ctxt->endCheckState = uVar23;
  return local_54;
switchD_0016c211_caseD_0:
  uVar13 = len;
  if (1 < ctxt->disableSAX) goto switchD_0016c211_caseD_5;
  goto LAB_0016be01;
}

Assistant:

static int
htmlParseCharData(htmlParserCtxtPtr ctxt, int partial) {
    xmlParserInputPtr input = ctxt->input;
    xmlChar utf8Char[4];
    int complete = 0;
    int done = 0;
    int mode;
    int eof = PARSER_PROGRESSIVE(ctxt);
    int line, col;

    mode = ctxt->endCheckState;

    line = input->line;
    col = input->col;

    while (!PARSER_STOPPED(ctxt)) {
        const xmlChar *chunk, *in, *repl;
        size_t avail;
        int replSize;
        int skip = 0;
        int ncr = 0;
        int ncrSize = 0;
        int cp = 0;

        chunk = input->cur;
        avail = input->end - chunk;
        in = chunk;

        repl = BAD_CAST "";
        replSize = 0;

        while (!PARSER_STOPPED(ctxt)) {
            size_t j;
            int cur, size;

            if (avail <= 64) {
                if (!eof) {
                    size_t oldAvail = avail;
                    size_t off = in - chunk;

                    input->cur = in;

                    xmlParserGrow(ctxt);

                    in = input->cur;
                    chunk = in - off;
                    input->cur = chunk;
                    avail = input->end - in;

                    if (oldAvail == avail)
                        eof = 1;
                }

                if (avail == 0) {
                    if ((partial) && (ncr)) {
                        in -= ncrSize;
                        ncrSize = 0;
                    }

                    done = 1;
                    break;
                }
            }

            /* Accelerator */
            if (!ncr) {
                while (avail > 0) {
                    static const unsigned mask[8] = {
                        0x00002401, 0x10002040,
                        0x00000000, 0x00000000,
                        0xFFFFFFFF, 0xFFFFFFFF,
                        0xFFFFFFFF, 0xFFFFFFFF
                    };
                    cur = *in;
                    if ((1u << (cur & 0x1F)) & mask[cur >> 5])
                        break;
                    col += 1;
                    in += 1;
                    avail -= 1;
                }

                if ((!eof) && (avail <= 64))
                    continue;
                if (avail == 0)
                    continue;
            }

            cur = *in;
            size = 1;
            col += 1;

            if (ncr) {
                int lc = cur | 0x20;
                int digit;

                if ((cur >= '0') && (cur <= '9')) {
                    digit = cur - '0';
                } else if ((ncr == 16) && (lc >= 'a') && (lc <= 'f')) {
                    digit = (lc - 'a') + 10;
                } else {
                    if (cur == ';') {
                        in += 1;
                        size += 1;
                        ncrSize += 1;
                    }
                    goto next_chunk;
                }

                cp = cp * ncr + digit;
                if (cp >= 0x110000)
                    cp = 0x110000;

                ncrSize += 1;

                goto next_char;
            }

            switch (cur) {
            case '<':
                if (mode == 0) {
                    done = 1;
                    complete = 1;
                    goto next_chunk;
                }
                if (mode == DATA_PLAINTEXT)
                    break;

                j = 1;
                if (j < avail) {
                    if ((mode == DATA_SCRIPT) && (in[j] == '!')) {
                        /* Check for comment start */

                        j += 1;
                        if ((j < avail) && (in[j] == '-')) {
                            j += 1;
                            if ((j < avail) && (in[j] == '-'))
                                mode = DATA_SCRIPT_ESC1;
                        }
                    } else {
                        int i = 0;
                        int solidus = 0;

                        /* Check for tag */

                        if (in[j] == '/') {
                            j += 1;
                            solidus = 1;
                        }

                        if ((solidus) || (mode == DATA_SCRIPT_ESC1)) {
                            while ((j < avail) &&
                                   (ctxt->name[i] != 0) &&
                                   (ctxt->name[i] == (in[j] | 0x20))) {
                                i += 1;
                                j += 1;
                            }

                            if ((ctxt->name[i] == 0) && (j < avail)) {
                                int c = in[j];

                                if ((c == '>') || (c == '/') ||
                                    (IS_WS_HTML(c))) {
                                    if ((mode == DATA_SCRIPT_ESC1) &&
                                        (!solidus)) {
                                        mode = DATA_SCRIPT_ESC2;
                                    } else if (mode == DATA_SCRIPT_ESC2) {
                                        mode = DATA_SCRIPT_ESC1;
                                    } else {
                                        complete = 1;
                                        done = 1;
                                        goto next_chunk;
                                    }
                                }
                            }
                        }
                    }
                }

                if ((partial) && (j >= avail)) {
                    done = 1;
                    goto next_chunk;
                }

                break;

            case '-':
                if ((mode != DATA_SCRIPT_ESC1) && (mode != DATA_SCRIPT_ESC2))
                    break;

                /* Check for comment end */

                j = 1;
                if ((j < avail) && (in[j] == '-')) {
                    j += 1;
                    if ((j < avail) && (in[j] == '>'))
                        mode = DATA_SCRIPT;
                }

                if ((partial) && (j >= avail)) {
                    done = 1;
                    goto next_chunk;
                }

                break;

            case '&':
                if ((mode != 0) && (mode != DATA_RCDATA))
                    break;

                j = 1;

                if ((j < avail) && (in[j] == '#')) {
                    j += 1;
                    if (j < avail) {
                        if ((in[j] | 0x20) == 'x') {
                            j += 1;
                            if ((j < avail) && (IS_HEX_DIGIT(in[j]))) {
                                ncr = 16;
                                size = 3;
                                ncrSize = 3;
                                cp = 0;
                            }
                        } else if (IS_ASCII_DIGIT(in[j])) {
                            ncr = 10;
                            size = 2;
                            ncrSize = 2;
                            cp = 0;
                        }
                    }
                } else {
                    if (partial) {
                        int terminated = 0;
                        size_t i;

                        /*
                         * &CounterClockwiseContourIntegral; has 33 bytes.
                         */
                        for (i = 1; i < avail; i++) {
                            if ((i >= 32) ||
                                (!IS_ASCII_LETTER(in[i]) &&
                                 ((i < 2) || !IS_ASCII_DIGIT(in[i])))) {
                                terminated = 1;
                                break;
                            }
                        }

                        if (!terminated) {
                            done = 1;
                            goto next_chunk;
                        }
                    }

                    repl = htmlFindEntityPrefix(in + j,
                                                avail - j,
                                                /* isAttr */ 0,
                                                &skip, &replSize);
                    if (repl != NULL) {
                        skip += 1;
                        goto next_chunk;
                    }

                    skip = 0;
                }

                if ((partial) && (j >= avail)) {
                    done = 1;
                    goto next_chunk;
                }

                break;

            case '\0':
                skip = 1;
                repl = BAD_CAST "\xEF\xBF\xBD";
                replSize = 3;
                goto next_chunk;

            case '\n':
                line += 1;
                col = 1;
                break;

            case '\r':
                if (partial && avail < 2) {
                    done = 1;
                    goto next_chunk;
                }

                skip = 1;
                if (in[1] != 0x0A) {
                    repl = BAD_CAST "\x0A";
                    replSize = 1;
                }
                goto next_chunk;

            default:
                if (cur < 0x80)
                    break;

                if ((input->flags & XML_INPUT_HAS_ENCODING) == 0) {
                    xmlChar * guess;

                    if (in > chunk)
                        goto next_chunk;

#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
                    guess = NULL;
#else
                    guess = htmlFindEncoding(ctxt);
#endif
                    if (guess == NULL) {
                        xmlSwitchEncoding(ctxt, XML_CHAR_ENCODING_8859_1);
                    } else {
                        xmlSwitchEncodingName(ctxt, (const char *) guess);
                        xmlFree(guess);
                    }
                    input->flags |= XML_INPUT_HAS_ENCODING;

                    eof = PARSER_PROGRESSIVE(ctxt);
                    goto restart;
                }

                size = htmlValidateUtf8(ctxt, in, avail, partial);

                if ((partial) && (size == 0)) {
                    done = 1;
                    goto next_chunk;
                }

                if (size <= 0) {
                    skip = 1;
                    repl = BAD_CAST "\xEF\xBF\xBD";
                    replSize = 3;
                    goto next_chunk;
                }

                break;
            }

next_char:
            in += size;
            avail -= size;
        }

next_chunk:
        if (ncrSize > 0) {
            skip = ncrSize;
            in -= ncrSize;

            repl = htmlCodePointToUtf8(cp, utf8Char, &replSize);
        }

        if (in > chunk) {
            input->cur += in - chunk;
            htmlCharDataSAXCallback(ctxt, chunk, in - chunk, mode);
        }

        input->cur += skip;
        if (replSize > 0)
            htmlCharDataSAXCallback(ctxt, repl, replSize, mode);

        SHRINK;

        if (done)
            break;

restart:
        ;
    }

    input->line = line;
    input->col = col;

    if (complete)
        ctxt->endCheckState = 0;
    else
        ctxt->endCheckState = mode;

    return(complete);
}